

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_impl.cc
# Opt level: O1

void __thiscall
QuickImpl::ProcessHelloOk(QuickImpl *this,string *ip,uint16_t port,uint8_t *data,int16_t data_len)

{
  __node_base_ptr p_Var1;
  key_type *__k;
  _Hash_node_base *p_Var2;
  Location local_30;
  
  __k = (key_type *)(data + 1);
  p_Var2 = (_Hash_node_base *)0x0;
  p_Var1 = std::
           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     (&(this->_connections)._M_h,
                      (ulong)*(uint *)(data + 1) % (this->_connections)._M_h._M_bucket_count,__k,
                      (ulong)*(uint *)(data + 1));
  if (p_Var1 != (__node_base_ptr)0x0) {
    p_Var2 = p_Var1->_M_nxt;
  }
  if (p_Var2 == (_Hash_node_base *)0x0) {
    local_30._function_name = "ProcessHelloOk";
    local_30._file_name =
         "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/quick/quick_impl.cc"
    ;
    local_30._line_number = 0xfd;
    LogWrapper::Write(&g_quic_log,&local_30,2,anon_var_dwarf_78a50,(ulong)*__k);
  }
  else {
    *(undefined1 *)((long)&p_Var2[2]._M_nxt[0xb]._M_nxt + 4) = 1;
    local_30._function_name = "ProcessHelloOk";
    local_30._file_name =
         "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/quick/quick_impl.cc"
    ;
    local_30._line_number = 0x101;
    LogWrapper::Write(&g_quic_log,&local_30,2,anon_var_dwarf_78a66);
    (**(code **)(*(long *)this->_quick_cb + 0x10))(this->_quick_cb,*__k);
  }
  return;
}

Assistant:

void QuickImpl::ProcessHelloOk(const std::string &ip, uint16_t port, const uint8_t* data, int16_t data_len)
{
	QuickHelloOk* msg = (QuickHelloOk*)data;
	auto iter = _connections.find(msg->session_id);
	if (iter == _connections.end()) {
		g_quic_log.Write(RTC_FROM_HERE, LOG_LEVEL_INFO, "�Ҳ�����Ӧ��session id %u", msg->session_id);
		return;
	}
	iter->second->SetServerState(true);
	g_quic_log.Write(RTC_FROM_HERE, LOG_LEVEL_INFO, "�յ� hello ok��Ϣ�� �����ѽ���");
	_quick_cb->OnConnected(msg->session_id);
}